

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void duckdb_je_arena_nthreads_dec(arena_t *arena,_Bool internal)

{
  undefined3 in_register_00000031;
  
  LOCK();
  arena->nthreads[CONCAT31(in_register_00000031,internal)].repr =
       arena->nthreads[CONCAT31(in_register_00000031,internal)].repr - 1;
  UNLOCK();
  return;
}

Assistant:

void
arena_nthreads_dec(arena_t *arena, bool internal) {
	atomic_fetch_sub_u(&arena->nthreads[internal], 1, ATOMIC_RELAXED);
}